

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::NetTypeDeclarationSyntax::setChild
          (NetTypeDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00230cd8 + *(int *)(&DAT_00230cd8 + index * 4)))();
  return;
}

Assistant:

void NetTypeDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 3: name = child.token(); return;
        case 4: withFunction = child.node() ? &child.node()->as<WithFunctionClauseSyntax>() : nullptr; return;
        case 5: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}